

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

bool __thiscall duckdb::QuantileBindData::Equals(QuantileBindData *this,FunctionData *other_p)

{
  pointer pQVar1;
  pointer __s1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  size_t __n;
  QuantileBindData *other;
  Value *rhs;
  pointer this_00;
  
  if (this->desc != (bool)*(char *)&other_p[7]._vptr_FunctionData) {
    return false;
  }
  this_00 = (this->quantiles).
            super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>.
            super__Vector_base<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pQVar1 = (this->quantiles).
           super_vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>.
           super__Vector_base<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>._M_impl
           .super__Vector_impl_data._M_finish;
  rhs = (Value *)other_p[1]._vptr_FunctionData;
  if ((long)pQVar1 - (long)this_00 == (long)other_p[2]._vptr_FunctionData - (long)rhs) {
    for (; this_00 != pQVar1; this_00 = this_00 + 1) {
      bVar3 = Value::operator==(&this_00->val,rhs);
      if (!bVar3) {
        return false;
      }
      rhs = (Value *)((long)&rhs[1].value_ + 8);
    }
    __s1 = (this->order).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
    puVar2 = (this->order).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __n = (long)puVar2 - (long)__s1;
    if (__n == (long)other_p[5]._vptr_FunctionData - (long)other_p[4]._vptr_FunctionData) {
      if (puVar2 == __s1) {
        return true;
      }
      iVar4 = bcmp(__s1,other_p[4]._vptr_FunctionData,__n);
      return iVar4 == 0;
    }
  }
  return false;
}

Assistant:

bool QuantileBindData::Equals(const FunctionData &other_p) const {
	auto &other = other_p.Cast<QuantileBindData>();
	return desc == other.desc && quantiles == other.quantiles && order == other.order;
}